

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O3

void match_list_free(match_list *list)

{
  match *pmVar1;
  match *p;
  
  if (list != (match_list *)0x0) {
    do {
      pmVar1 = ((match *)list)->next;
      archive_mstring_clean(&((match *)list)->pattern);
      free(list);
      list = (match_list *)pmVar1;
    } while (pmVar1 != (match *)0x0);
  }
  return;
}

Assistant:

static void
match_list_free(struct match_list *list)
{
	struct match *p, *q;

	for (p = list->first; p != NULL; ) {
		q = p;
		p = p->next;
		archive_mstring_clean(&(q->pattern));
		free(q);
	}
}